

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qsslsocket.cpp
# Opt level: O2

bool __thiscall QSslSocket::waitForDisconnected(QSslSocket *this,int msecs)

{
  QAbstractSocketPrivate *this_00;
  _func_int **pp_Var1;
  Data *pDVar2;
  bool bVar3;
  char cVar4;
  undefined1 uVar5;
  SocketState SVar6;
  int iVar7;
  undefined4 uVar8;
  SocketError errorCode;
  QLoggingCategory *pQVar9;
  long in_FS_OFFSET;
  QArrayDataPointer<char16_t> local_50;
  char *local_38;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = *(QAbstractSocketPrivate **)&(this->super_QTcpSocket).super_QAbstractSocket.field_0x8;
  SVar6 = QAbstractSocket::state((QAbstractSocket *)this);
  if (SVar6 == UnconnectedState) {
    pQVar9 = QtPrivateLogging::lcSsl();
    if (((pQVar9->field_2).bools.enabledWarning._q_value._M_base._M_i & 1U) != 0) {
      local_38 = pQVar9->name;
      local_50.d._0_4_ = 2;
      local_50._4_8_ = 0;
      local_50._12_8_ = 0;
      local_50.size._4_4_ = 0;
      bVar3 = false;
      QMessageLogger::warning
                ((char *)&local_50,
                 "QSslSocket::waitForDisconnected() is not allowed in UnconnectedState");
      goto LAB_002318c3;
    }
LAB_002318c0:
    bVar3 = false;
  }
  else {
    pp_Var1 = this_00[1].super_QAbstractSocketEngineReceiver._vptr_QAbstractSocketEngineReceiver;
    if (pp_Var1 == (_func_int **)0x0) goto LAB_002318c0;
    if ((*(int *)(this_00 + 1) == 0) && (this_00[1].field_0x4 == '\0')) {
      if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
        uVar5 = (**(code **)(*pp_Var1 + 0x138))(pp_Var1,msecs);
        return (bool)uVar5;
      }
      goto LAB_0023193e;
    }
    QElapsedTimer::start();
    if (this_00[1].field_0x5 == '\0') {
      bVar3 = waitForEncrypted(this,msecs);
      if (!bVar3) goto LAB_002318c0;
    }
    if (((*(long *)&this_00->field_0x98 != 0) &&
        (*(long *)(*(long *)&this_00->field_0x98 + 0x18) != 0)) &&
       (pDVar2 = this_00[1].hostName.d.d, pDVar2 != (Data *)0x0)) {
      (**(code **)(*(long *)&pDVar2->super_QArrayData + 200))();
    }
    SVar6 = QAbstractSocket::state((QAbstractSocket *)this);
    bVar3 = true;
    if (SVar6 != UnconnectedState) {
      pp_Var1 = this_00[1].super_QAbstractSocketEngineReceiver._vptr_QAbstractSocketEngineReceiver;
      iVar7 = QElapsedTimer::elapsed();
      uVar8 = qt_subtract_from_timeout(msecs,iVar7);
      cVar4 = (**(code **)(*pp_Var1 + 0x138))(pp_Var1,uVar8);
      if (cVar4 == '\0') {
        SVar6 = QAbstractSocket::state
                          ((QAbstractSocket *)
                           this_00[1].super_QAbstractSocketEngineReceiver.
                           _vptr_QAbstractSocketEngineReceiver);
        QAbstractSocket::setSocketState((QAbstractSocket *)this,SVar6);
        errorCode = QAbstractSocket::error
                              ((QAbstractSocket *)
                               this_00[1].super_QAbstractSocketEngineReceiver.
                               _vptr_QAbstractSocketEngineReceiver);
        QIODevice::errorString();
        QAbstractSocketPrivate::setError(this_00,errorCode,(QString *)&local_50);
        QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_50);
        goto LAB_002318c0;
      }
    }
  }
LAB_002318c3:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
    return bVar3;
  }
LAB_0023193e:
  __stack_chk_fail();
}

Assistant:

bool QSslSocket::waitForDisconnected(int msecs)
{
    Q_D(QSslSocket);

    // require calling connectToHost() before waitForDisconnected()
    if (state() == UnconnectedState) {
        qCWarning(lcSsl, "QSslSocket::waitForDisconnected() is not allowed in UnconnectedState");
        return false;
    }

    if (!d->plainSocket)
        return false;
    // Forward to the plain socket unless the connection is secure.
    if (d->mode == UnencryptedMode && !d->autoStartHandshake)
        return d->plainSocket->waitForDisconnected(msecs);

    QElapsedTimer stopWatch;
    stopWatch.start();

    if (!d->connectionEncrypted) {
        // Wait until we've entered encrypted mode, or until a failure occurs.
        if (!waitForEncrypted(msecs))
            return false;
    }
    // We are delaying the disconnect, if the write buffer is not empty.
    // So, start the transmission.
    if (!d->writeBuffer.isEmpty())
        d->transmit();

    // At this point, the socket might be disconnected, if disconnectFromHost()
    // was called just after the connectToHostEncrypted() call. Also, we can
    // lose the connection as a result of the transmit() call.
    if (state() == UnconnectedState)
        return true;

    bool retVal = d->plainSocket->waitForDisconnected(qt_subtract_from_timeout(msecs, stopWatch.elapsed()));
    if (!retVal) {
        setSocketState(d->plainSocket->state());
        d->setError(d->plainSocket->error(), d->plainSocket->errorString());
    }
    return retVal;
}